

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O0

void __thiscall
QDnsLookup::setNameserver(QDnsLookup *this,Protocol protocol,QHostAddress *nameserver,quint16 port)

{
  undefined2 in_CX;
  QHostAddress *in_RDI;
  undefined6 in_stack_ffffffffffffffe0;
  
  Qt::beginPropertyUpdateGroup();
  setNameserver((QDnsLookup *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),in_RDI);
  setNameserverPort((QDnsLookup *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),
                    (quint16)((ulong)in_RDI >> 0x30));
  setNameserverProtocol
            ((QDnsLookup *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),
             (Protocol)((ulong)in_RDI >> 0x38));
  Qt::endPropertyUpdateGroup();
  return;
}

Assistant:

void QDnsLookup::setNameserver(Protocol protocol, const QHostAddress &nameserver, quint16 port)
{
    Qt::beginPropertyUpdateGroup();
    setNameserver(nameserver);
    setNameserverPort(port);
    setNameserverProtocol(protocol);
    Qt::endPropertyUpdateGroup();
}